

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise::forward(ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob)

{
  int iVar1;
  int *piVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  ulong uVar7;
  int iVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int k;
  ulong uVar17;
  size_type __n;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  float fVar21;
  undefined1 auVar22 [16];
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_150;
  ulong local_148;
  allocator_type local_139;
  void *local_138;
  void *local_130;
  void *local_128;
  uint local_11c;
  Mat local_118;
  ulong local_e0;
  long local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  ulong local_b8;
  void *local_b0;
  long local_a8;
  void *local_a0;
  void *local_98;
  int local_8c;
  ulong local_88;
  long local_80;
  void *local_78;
  long local_70;
  long local_68;
  void *local_60;
  long local_58;
  void *local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar1 = bottom_blob->c;
  if (iVar1 % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  iVar15 = bottom_blob->w;
  iVar11 = bottom_blob->h;
  uVar18 = (this->kernel_w + -1) * this->dilation_w;
  uVar19 = (this->kernel_h + -1) * this->dilation_h;
  local_118.data = bottom_blob->data;
  local_118.refcount = bottom_blob->refcount;
  local_118.elemsize = bottom_blob->elemsize;
  local_118.dims = bottom_blob->dims;
  if (local_118.refcount != (int *)0x0) {
    LOCK();
    *local_118.refcount = *local_118.refcount + 1;
    UNLOCK();
  }
  local_118.w = bottom_blob->w;
  local_118.h = bottom_blob->h;
  local_118.c = bottom_blob->c;
  local_118.cstep = bottom_blob->cstep;
  iVar4 = this->pad_w;
  if ((iVar4 < 1) && (this->pad_h < 1)) {
    if (this->pad_h == -0xe9 && iVar4 == -0xe9) {
      iVar14 = uVar18 - (iVar15 + -1) % this->stride_w;
      iVar4 = uVar19 - (iVar11 + -1) % this->stride_h;
      if ((iVar14 < 1) && (iVar4 < 1)) {
LAB_00131df5:
        bVar20 = true;
        iVar11 = local_118.h;
        iVar15 = local_118.w;
      }
      else {
        copy_make_border(bottom_blob,&local_118,iVar4 / 2,iVar4 - iVar4 / 2,iVar14 / 2,
                         iVar14 - iVar14 / 2,0,0.0);
        if (local_118.data == (void *)0x0) {
          bVar20 = false;
        }
        else {
          if ((long)local_118.c * local_118.cstep != 0) goto LAB_00131df5;
          bVar20 = false;
        }
      }
      iVar4 = -100;
      if (!bVar20) goto LAB_00132120;
    }
  }
  else {
    copy_make_border(bottom_blob,&local_118,this->pad_h,this->pad_h,iVar4,iVar4,0,0.0);
    iVar4 = -100;
    if ((local_118.data == (void *)0x0) || ((long)local_118.c * local_118.cstep == 0))
    goto LAB_00132120;
    iVar11 = local_118.h;
    iVar15 = local_118.w;
  }
  uVar12 = (long)(int)(~uVar18 + iVar15) / (long)this->stride_w;
  local_88 = uVar12 & 0xffffffff;
  uVar7 = (long)(int)(~uVar19 + iVar11) / (long)this->stride_h;
  local_b8 = uVar7 & 0xffffffff;
  uVar19 = (int)uVar12 + 1;
  uVar18 = (int)uVar7 + 1;
  local_e0 = (ulong)uVar18;
  iVar11 = this->num_output;
  auVar22._0_4_ = -(uint)(top_blob->dims == 3);
  auVar22._4_4_ = -(uint)(uVar19 == top_blob->w);
  auVar22._8_4_ = -(uint)(uVar18 == top_blob->h);
  auVar22._12_4_ = -(uint)(iVar11 == top_blob->c);
  iVar4 = movmskps(3,auVar22);
  if ((iVar4 != 0xf) || (top_blob->elemsize != 4)) {
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->elemsize = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = uVar19;
    top_blob->h = (int)local_e0;
    top_blob->c = iVar11;
    uVar12 = (long)(int)((int)local_e0 * uVar19) + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = uVar12;
    lVar13 = uVar12 * (long)iVar11;
    if (lVar13 != 0) {
      pvVar6 = malloc(lVar13 * 4 + 0x1c);
      pvVar9 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar9 - 8) = pvVar6;
      top_blob->data = pvVar9;
      piVar2 = (int *)((long)pvVar9 + lVar13 * 4);
      top_blob->refcount = piVar2;
      *piVar2 = 1;
    }
  }
  iVar4 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar18 = this->kernel_w * this->kernel_h;
    __n = (size_type)(int)uVar18;
    std::vector<int,_std::allocator<int>_>::vector(&local_48,__n,&local_139);
    if (0 < this->kernel_h) {
      iVar11 = this->dilation_h;
      iVar4 = this->dilation_w;
      iVar14 = this->kernel_w;
      iVar16 = 0;
      iVar8 = 0;
      iVar10 = 0;
      do {
        if (0 < this->kernel_w) {
          lVar13 = 0;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar16 + lVar13] = iVar8;
            iVar8 = iVar8 + this->dilation_w;
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 < this->kernel_w);
          iVar16 = iVar16 + (int)lVar13;
        }
        iVar8 = iVar8 + (iVar15 * iVar11 - iVar4 * iVar14);
        iVar10 = iVar10 + 1;
      } while (iVar10 < this->kernel_h);
    }
    iVar15 = this->group;
    if (iVar15 == this->num_output && iVar1 == iVar15) {
      local_128 = (void *)(long)this->group;
      if (0 < (long)local_128) {
        local_b0 = (void *)(top_blob->cstep * top_blob->elemsize);
        local_130 = top_blob->data;
        pvVar6 = (this->weight_data).data;
        local_c0 = CONCAT44(local_c0._4_4_,local_118.w);
        local_138 = local_118.data;
        local_c8 = local_118.cstep * local_118.elemsize;
        local_98 = (void *)(long)(int)uVar19;
        local_150 = (void *)0x0;
        do {
          if (-1 < (int)local_b8) {
            local_a0 = (void *)(local_c8 * (long)local_150 + (long)local_118.data);
            pvVar9 = (void *)((long)local_b0 * (long)local_150 + (long)local_130);
            iVar1 = this->bias_term;
            iVar11 = this->stride_h * local_118.w;
            local_a8 = CONCAT44(local_a8._4_4_,iVar11);
            iVar15 = this->stride_w;
            local_148 = 0;
            do {
              if (-1 < (int)local_88) {
                pvVar3 = (this->bias_data).data;
                uVar12 = 0;
                do {
                  if (iVar1 == 0) {
                    fVar21 = 0.0;
                  }
                  else {
                    fVar21 = *(float *)((long)pvVar3 + (long)local_150 * 4);
                  }
                  if (0 < (int)uVar18) {
                    uVar7 = 0;
                    do {
                      fVar21 = fVar21 + *(float *)((long)pvVar6 + uVar7 * 4) *
                                        *(float *)((long)local_a0 +
                                                  (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar7] *
                                                  4 + uVar12 * (long)iVar15 * 4 +
                                                      (long)(iVar11 * (int)local_148) * 4);
                      uVar7 = uVar7 + 1;
                    } while (uVar18 != uVar7);
                  }
                  *(float *)((long)pvVar9 + uVar12 * 4) = fVar21;
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar19);
              }
              pvVar9 = (void *)((long)pvVar9 + (long)local_98 * 4);
              local_148 = local_148 + 1;
            } while (local_148 != local_e0);
          }
          local_150 = (void *)((long)local_150 + 1);
          pvVar6 = (void *)((long)pvVar6 + __n * 4);
        } while (local_150 != local_128);
      }
    }
    else {
      uVar5 = iVar1 / iVar15;
      local_11c = this->num_output / iVar15;
      local_70 = (long)this->group;
      if (0 < local_70) {
        local_60 = top_blob->data;
        local_68 = top_blob->cstep * top_blob->elemsize;
        local_78 = (this->weight_data).data;
        local_c0 = (long)(int)uVar19;
        local_80 = (long)(int)local_11c;
        local_50 = (void *)(ulong)local_11c;
        local_e0 = (ulong)uVar19;
        local_8c = uVar5 * uVar18 * local_11c;
        local_c8 = (long)(int)(uVar5 * uVar18) * 4;
        local_d0 = 0;
        local_d8 = 0;
        do {
          if (0 < (int)local_11c) {
            local_128 = (void *)((long)local_78 + (long)(int)local_d0 * 4);
            local_58 = local_d8 * local_80;
            local_138 = (void *)0x0;
            do {
              if (-1 < (int)local_b8) {
                local_b0 = (void *)((long)local_138 + local_58);
                pvVar6 = (void *)(local_68 * (long)local_b0 + (long)local_60);
                iVar1 = this->bias_term;
                local_130 = (void *)0x0;
                do {
                  if (-1 < (int)local_88) {
                    local_98 = (this->bias_data).data;
                    local_a0 = (void *)((long)(local_118.w * (int)local_130 * this->stride_h) * 4 +
                                       (long)local_118.data);
                    local_a8 = (long)this->stride_w;
                    uVar12 = 0;
                    do {
                      if (iVar1 == 0) {
                        fVar21 = 0.0;
                      }
                      else {
                        fVar21 = *(float *)((long)local_98 + (long)local_b0 * 4);
                      }
                      if (0 < (int)uVar5) {
                        uVar7 = 0;
                        pvVar9 = local_128;
                        do {
                          if (0 < (int)uVar18) {
                            uVar17 = 0;
                            do {
                              fVar21 = fVar21 + *(float *)((long)pvVar9 + uVar17 * 4) *
                                                *(float *)((long)local_a0 +
                                                          (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar17] *
                                                  4 + (uVar7 + uVar5 * (int)local_d8) *
                                                      local_118.cstep * local_118.elemsize +
                                                      uVar12 * local_a8 * 4);
                              uVar17 = uVar17 + 1;
                            } while (uVar18 != uVar17);
                          }
                          uVar7 = uVar7 + 1;
                          pvVar9 = (void *)((long)pvVar9 + __n * 4);
                        } while (uVar7 != uVar5);
                      }
                      *(float *)((long)pvVar6 + uVar12 * 4) = fVar21;
                      uVar12 = uVar12 + 1;
                    } while (uVar12 != local_e0);
                  }
                  pvVar6 = (void *)((long)pvVar6 + local_c0 * 4);
                  uVar19 = (int)local_130 + 1;
                  bVar20 = (int)local_130 != (int)local_b8;
                  local_130 = (void *)(ulong)uVar19;
                } while (bVar20);
              }
              local_138 = (void *)((long)local_138 + 1);
              local_128 = (void *)((long)local_128 + local_c8);
            } while (local_138 != local_50);
          }
          local_d8 = local_d8 + 1;
          local_d0 = (ulong)(uint)((int)local_d0 + local_8c);
        } while (local_d8 != local_70);
      }
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar4 = 0;
  }
LAB_00132120:
  if (local_118.refcount != (int *)0x0) {
    LOCK();
    *local_118.refcount = *local_118.refcount + -1;
    UNLOCK();
    if ((*local_118.refcount == 0) && (local_118.data != (void *)0x0)) {
      free(*(void **)((long)local_118.data - 8));
    }
  }
  return iVar4;
}

Assistant:

int ConvolutionDepthWise::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for
        for (int g=0; g<group; g++)
        {
            float* outptr = top_blob.channel(g);
            const float* kptr = (const float*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[g];

                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        float w = kptr[k];
                        sum += val * w;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

#ifdef _WIN32
    #pragma omp parallel for
#else // _WIN32
    #pragma omp parallel for collapse(2)
#endif // _WIN32
    for (int g=0; g<group; g++)
    {
        for (int p=0; p<num_output_g; p++)
        {
            float* outptr = top_blob.channel(g * num_output_g + p);
            const float* weight_data_ptr = (const float*)weight_data + maxk * channels_g * num_output_g * g;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[num_output_g * g + p];

                    const float* kptr = weight_data_ptr + maxk * channels_g * p;

                    // channels_g
                    for (int q=0; q<channels_g; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            float w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }
    }

    return 0;
}